

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O1

bool __thiscall llbuild::basic::FileChecksumHasher::readAndDigest(FileChecksumHasher *this)

{
  FILE *pFVar1;
  size_t sVar2;
  uint8_t buffer [16384];
  undefined1 auStack_4018 [16384];
  
  pFVar1 = fopen((this->path->_M_dataplus)._M_p,"rb");
  this->file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    sVar2 = fread(auStack_4018,1,0x4000,(FILE *)this->file);
    while (sVar2 != 0) {
      (*this->_vptr_FileChecksumHasher[3])(this,auStack_4018,sVar2);
      sVar2 = fread(auStack_4018,1,0x4000,(FILE *)this->file);
    }
    fclose((FILE *)this->file);
    (*this->_vptr_FileChecksumHasher[2])(this);
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool readAndDigest() {
    this->file = std::fopen(path.c_str(), "rb");

    uint8_t buffer[4*4096];
    size_t bytesRead = 0;

    if (file != NULL) {
      while ((bytesRead = fread(buffer, 1, sizeof(buffer), file)) > 0) {
        update(buffer, bytesRead);
      }
      fclose(file);
      finalize();
      return true;
    } else {
      return false;
    }
  }